

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O3

size_t __thiscall gui::MenuBar::findMenuIndex(MenuBar *this,String *name)

{
  bool bVar1;
  out_of_range *this_00;
  pointer pMVar2;
  long lVar3;
  size_t sVar4;
  
  pMVar2 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar2) {
    lVar3 = 0;
    sVar4 = 0;
    do {
      bVar1 = sf::operator==((String *)((long)&(pMVar2->name).m_string._M_dataplus._M_p + lVar3),
                             name);
      if (bVar1) {
        return sVar4;
      }
      sVar4 = sVar4 + 1;
      pMVar2 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (sVar4 < (ulong)(((long)(this->menus_).
                                    super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 4)
                            * -0x3333333333333333));
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"MenuBar::findMenuIndex");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

size_t MenuBar::findMenuIndex(const sf::String& name) const {
    for (size_t i = 0; i < menus_.size(); ++i) {
        if (menus_[i].name == name) {
            return i;
        }
    }
    throw std::out_of_range("MenuBar::findMenuIndex");
}